

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O0

void RDL_findTransitiveClosure(RDL_URFinfo *uInfo)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  RDL_stack *stack;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *pvVar4;
  uint *puVar5;
  uint *curr_elem;
  uint next_free_element;
  uint *elements;
  uint v;
  uint u;
  uint *cc_size;
  uint **cc;
  uint cc_id;
  char *visited;
  RDL_stack *dfs_stack;
  uint l;
  uint k;
  uint j;
  uint i;
  RDL_URFinfo *uInfo_local;
  
  stack = RDL_stack_new();
  for (k = 0; k < uInfo->nofWeights; k = k + 1) {
    __s = malloc((ulong)uInfo->nofProtos[k]);
    memset(__s,0,(ulong)uInfo->nofProtos[k]);
    cc._4_4_ = 0;
    __ptr = malloc((ulong)uInfo->nofProtos[k] << 3);
    __ptr_00 = malloc((ulong)uInfo->nofProtos[k] << 2);
    __ptr_01 = malloc((ulong)uInfo->nofProtos[k] << 2);
    curr_elem._4_4_ = 0;
    for (l = 0; l < uInfo->nofProtos[k]; l = l + 1) {
      if (*(char *)((long)__s + (ulong)l) == '\0') {
        pvVar4 = malloc((ulong)uInfo->nofProtos[k] << 2);
        *(void **)((long)__ptr + (ulong)cc._4_4_ * 8) = pvVar4;
        *(undefined4 *)((long)__ptr_00 + (ulong)cc._4_4_ * 4) = 0;
        *(uint *)((long)__ptr_01 + (ulong)curr_elem._4_4_ * 4) = l;
        RDL_stack_push(stack,(void *)((long)__ptr_01 + (ulong)curr_elem._4_4_ * 4));
        curr_elem._4_4_ = curr_elem._4_4_ + 1;
        *(undefined1 *)((long)__s + (ulong)l) = 1;
        while (iVar3 = RDL_stack_empty(stack), iVar3 == 0) {
          puVar5 = (uint *)RDL_stack_top(stack);
          uVar1 = *puVar5;
          RDL_stack_pop(stack);
          *(uint *)(*(long *)((long)__ptr + (ulong)cc._4_4_ * 8) +
                   (ulong)*(uint *)((long)__ptr_00 + (ulong)cc._4_4_ * 4) * 4) = uVar1;
          *(int *)((long)__ptr_00 + (ulong)cc._4_4_ * 4) =
               *(int *)((long)__ptr_00 + (ulong)cc._4_4_ * 4) + 1;
          for (dfs_stack._0_4_ = 0; (uint)dfs_stack < uInfo->nofProtos[k];
              dfs_stack._0_4_ = (uint)dfs_stack + 1) {
            if ((*(char *)((long)__s + (ulong)(uint)dfs_stack) == '\0') &&
               (uInfo->URFrel[k][uVar1][(uint)dfs_stack] != '\0')) {
              *(undefined1 *)((long)__s + (ulong)(uint)dfs_stack) = 1;
              *(uint *)((long)__ptr_01 + (ulong)curr_elem._4_4_ * 4) = (uint)dfs_stack;
              RDL_stack_push(stack,(void *)((long)__ptr_01 + (ulong)curr_elem._4_4_ * 4));
              curr_elem._4_4_ = curr_elem._4_4_ + 1;
            }
          }
        }
        cc._4_4_ = cc._4_4_ + 1;
      }
    }
    for (l = 0; l < cc._4_4_; l = l + 1) {
      for (dfs_stack._4_4_ = 0; dfs_stack._0_4_ = dfs_stack._4_4_,
          dfs_stack._4_4_ < *(uint *)((long)__ptr_00 + (ulong)l * 4);
          dfs_stack._4_4_ = dfs_stack._4_4_ + 1) {
        while (dfs_stack._0_4_ = (uint)dfs_stack + 1,
              (uint)dfs_stack < *(uint *)((long)__ptr_00 + (ulong)l * 4)) {
          uVar1 = *(uint *)(*(long *)((long)__ptr + (ulong)l * 8) + (ulong)dfs_stack._4_4_ * 4);
          uVar2 = *(uint *)(*(long *)((long)__ptr + (ulong)l * 8) + (ulong)(uint)dfs_stack * 4);
          uInfo->URFrel[k][uVar1][uVar2] = '\x01';
          uInfo->URFrel[k][uVar2][uVar1] = '\x01';
        }
      }
    }
    for (l = 0; l < cc._4_4_; l = l + 1) {
      free(*(void **)((long)__ptr + (ulong)l * 8));
    }
    free(__ptr);
    free(__ptr_00);
    free(__s);
    free(__ptr_01);
  }
  RDL_stack_delete(stack);
  return;
}

Assistant:

void RDL_findTransitiveClosure(RDL_URFinfo *uInfo)
{
  unsigned i,j,k,l;
  RDL_stack* dfs_stack;
  char* visited;
  unsigned cc_id;
  unsigned **cc;
  unsigned *cc_size;
  unsigned u, v;
  unsigned *elements;
  unsigned next_free_element;
  unsigned *curr_elem;

  dfs_stack = RDL_stack_new();

  for(i = 0; i < uInfo->nofWeights; ++i) {
    visited = malloc(uInfo->nofProtos[i] * sizeof(*visited));
    memset(visited, 0, uInfo->nofProtos[i] * sizeof(*visited));

    cc_id = 0;
    cc = malloc(uInfo->nofProtos[i] * sizeof(*cc));
    cc_size = malloc(uInfo->nofProtos[i] * sizeof(*cc_size));
    elements = malloc(uInfo->nofProtos[i] * sizeof(*elements));
    next_free_element = 0;

    /*
     * perform a DFS search on the URF relations
     * and collect the connected components
     */
    for(j = 0; j < uInfo->nofProtos[i]; ++j) {
      if (!visited[j]) {
        cc[cc_id] = malloc(uInfo->nofProtos[i] * sizeof(**cc));
        cc_size[cc_id] = 0;

        elements[next_free_element] = j;
        RDL_stack_push(dfs_stack, &(elements[next_free_element]));
        ++next_free_element;
        visited[j] = 1;
        while (!RDL_stack_empty(dfs_stack)) {
          curr_elem = RDL_stack_top(dfs_stack);
          k = *curr_elem;
          RDL_stack_pop(dfs_stack);

          /* save the connected components */
          cc[cc_id][cc_size[cc_id]] = k;
          ++cc_size[cc_id];

          for (l = 0; l < uInfo->nofProtos[i]; ++l) {
            if (!visited[l] && uInfo->URFrel[i][k][l]) {
              visited[l] = 1;
              elements[next_free_element] = l;
              RDL_stack_push(dfs_stack, &(elements[next_free_element]));
              ++next_free_element;
            }
          }
        }

        ++cc_id;
      }
    }

    /* every pair inside a CC is URF related */
    for(j = 0; j < cc_id; ++j) {
      for (k = 0; k < cc_size[j]; ++k) {
        for (l = k+1; l < cc_size[j]; ++l) {
          u = cc[j][k];
          v = cc[j][l];
          uInfo->URFrel[i][u][v] = 1;
          uInfo->URFrel[i][v][u] = 1;
        }
      }
    }

    for(j = 0; j < cc_id; ++j) {
      free(cc[j]);
    }
    free(cc);
    free(cc_size);
    free(visited);
    free(elements);
  }

  RDL_stack_delete(dfs_stack);
}